

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

bool __thiscall
Js::BigUInt::FInitFromDigits<unsigned_char>(BigUInt *this,uchar *prgch,int32 cch,int32 *pcchDig)

{
  byte bVar1;
  code *pcVar2;
  int clu;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  uint luMul;
  uint32 luAdd;
  
  AssertValid(this,true);
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x6f,"(cch >= 0)","cch >= 0");
    if (!bVar3) goto LAB_0069907e;
    *puVar4 = 0;
  }
  if (prgch == (uchar *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x70,"(prgch != 0)","prgch != 0");
    if (!bVar3) goto LAB_0069907e;
    *puVar4 = 0;
  }
  if (pcchDig == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x71,"(pcchDig != 0)","pcchDig != 0");
    if (!bVar3) goto LAB_0069907e;
    *puVar4 = 0;
  }
  clu = (cch + 8) / 9;
  if ((clu <= this->m_cluMax) || (bVar3 = FResize(this,clu), bVar3)) {
    this->m_clu = 0;
    *pcchDig = cch;
    if (prgch < prgch + cch) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar5 = 0;
      luMul = 1;
      luAdd = 0;
      do {
        bVar1 = prgch[lVar5];
        if ((bVar1 == 0x5f) || (bVar1 == 0x2e)) {
          *pcchDig = *pcchDig + -1;
        }
        else {
          bVar3 = NumberUtilities::IsDigit((uint)bVar1);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar4 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                        ,0x85,"(NumberUtilities::IsDigit(*prgch))",
                                        "NumberUtilities::IsDigit(*prgch)");
            if (!bVar3) goto LAB_0069907e;
            *puVar4 = 0;
          }
          if (luMul == 1000000000) {
            bVar3 = FMulAdd(this,1000000000,luAdd);
            luMul = 1;
            luAdd = 0;
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar4 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                          ,0x88,"(FMulAdd(luMul, luAdd))","FMulAdd(luMul, luAdd)");
              if (!bVar3) goto LAB_0069907e;
              *puVar4 = 0;
              luAdd = 0;
            }
          }
          luMul = luMul * 10;
          luAdd = ((uint)prgch[lVar5] + luAdd * 10) - 0x30;
        }
        lVar5 = lVar5 + 1;
      } while (cch != lVar5);
    }
    else {
      luMul = 1;
      luAdd = 0;
    }
    if (luMul < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x8f,"(1 < luMul)","1 < luMul");
      if (!bVar3) goto LAB_0069907e;
      *puVar4 = 0;
    }
    bVar3 = FMulAdd(this,luMul,luAdd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x90,"(FMulAdd(luMul, luAdd))","FMulAdd(luMul, luAdd)");
      if (!bVar3) {
LAB_0069907e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    AssertValid(this,true);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool BigUInt::FInitFromDigits(const EncodedChar *prgch, int32 cch, int32 *pcchDig)
    {
        AssertBi(this);
        Assert(cch >= 0);
        Assert(prgch != 0);
        Assert(pcchDig != 0);

        uint32 luAdd;
        uint32 luMul;
        int32 clu = (cch + 8) / 9;
        const EncodedChar *pchLim = prgch + cch;

        if (clu > m_cluMax && !FResize(clu))
            return false;
        m_clu = 0;

        luAdd = 0;
        luMul = 1;
        for (*pcchDig = cch; prgch < pchLim; prgch++)
        {
            if (*prgch == '.' || *prgch == '_')
            {
                (*pcchDig)--;
                continue;
            }
            Assert(NumberUtilities::IsDigit(*prgch));
            if (luMul == 1000000000)
            {
                AssertVerify(FMulAdd(luMul, luAdd));
                luMul = 1;
                luAdd = 0;
            }
            luMul *= 10;
            luAdd = luAdd * 10 + *prgch - '0';
        }
        Assert(1 < luMul);
        AssertVerify(FMulAdd(luMul, luAdd));

        AssertBi(this);
        return true;
    }